

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O1

void Js::Profiler::ForEachNode<Js::Profiler::Print(Js::Phase)::__0>
               (Phase tag,TypeNode *node,anon_class_32_4_bc7babac visit,Phase parentTag)

{
  TypeNode *node_00;
  long lVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  TypeNode *child;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  if (node == (TypeNode *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0x1ad,"(node != 0)","Invalid usage: node must always be non null");
    if (!bVar4) {
LAB_00366a24:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar7 = 0;
  do {
    node_00 = node->children[uVar7];
    if (node_00 != (TypeNode *)0x0) {
      if (tag == uVar7) {
        if (*visit.foundNode == false) {
          *visit.foundNode = true;
          Output::Print(L"%-*s:%7s %5s %7s %5s %7s %7s %5s\n",0x1b,L"Profiler Report",L"Incl",L"(%)"
                        ,L"Excl",L"(%)",L"Max",L"Mean",L"Count");
          Output::Print(
                       L"-------------------------------------------------------------------------------\n"
                       );
        }
        if ((node_00->value).count == 0) {
          Output::Print(L"The phase : %s was never started",(&PhaseNames)[*visit.baseTag]);
        }
        else {
          uVar6 = 0;
          if (parentTag != InvalidPhase) {
            if (node_00->parent == (TreeNode<Js::UnitData,_373> *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar5 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                          ,0x180,"(parentNode)","parentNode");
              if (!bVar4) goto LAB_00366a24;
              *puVar5 = 0;
            }
            Output::Print(L"%-*s\n",0x1b,(&PhaseNames)[parentTag]);
            uVar6 = 1;
          }
          if (parentTag != InvalidPhase) {
            Output::SkipToColumn(1);
          }
          lVar1 = (node_00->value).incl;
          dVar8 = (double)lVar1;
          dVar9 = (double)*visit.freq;
          lVar2 = (node_00->value).excl;
          Output::Print(L"%-*s %7.1f %5d %7.1f %5d %7.1f %7.1f %5d\n",dVar8 / dVar9,
                        SUB84((double)lVar2 / dVar9,0),(double)(node_00->value).max / dVar9,
                        dVar8 / (double)(long)(*visit.freq * (ulong)(node_00->value).count),
                        (ulong)(uVar6 ^ 0x1b),(&PhaseNames)[*visit.baseTag],100,
                        (lVar2 * 100) / lVar1 & 0xffffffff);
          PrintTree(visit.this,node_00,node_00,uVar6 + 1,*visit.freq);
        }
      }
      else {
        ForEachNode<Js::Profiler::Print(Js::Phase)::__0>(tag,node_00,visit,(Phase)uVar7);
      }
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x175) {
      return;
    }
  } while( true );
}

Assistant:

void
    Profiler::ForEachNode(Phase tag, TypeNode *node, FVisit visit, Phase parentTag)
    {
        AssertMsg(node != NULL, "Invalid usage: node must always be non null");

        for(int i = 0; i < PhaseCount; i++)
        {
            if(node->ChildExistsAt(i))
            {
                TypeNode * child = node->GetChildAt(i);
                if(i == tag)
                {
                    visit(child, parentTag);
                }
                else
                {
                    ForEachNode(tag, child, visit, static_cast<Phase>(i));
                }
            }
        }
    }